

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseAbiTags(State *state)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  undefined2 local_2a;
  undefined6 uStack_28;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  uVar6 = *(undefined8 *)((long)&state->prev_name + 6);
  uStack_28 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
  local_2a = (undefined2)((ulong)pcVar5 >> 0x30);
  bVar8 = state->append;
  bVar1 = state->overflowed;
  state->append = false;
  bVar7 = OneOrMore(ParseAbiTag,state);
  if (bVar7) {
    bVar8 = (bool)(bVar8 & 1);
  }
  else {
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_28,local_2a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->overflowed = bVar1;
  }
  state->append = bVar8;
  return bVar7;
}

Assistant:

static bool ParseAbiTags(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (OneOrMore(ParseAbiTag, state)) {
    RestoreAppend(state, copy.append);
    return true;
  }
  *state = copy;
  return false;
}